

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-link.cpp
# Opt level: O0

size_t rtosc::ring_write_size(ringbuffer_t *ring)

{
  __atomic_base<long> *this;
  __atomic_base<long> *p_Var1;
  ulong uVar2;
  long in_RDI;
  size_t r;
  size_t w;
  __atomic_base<long> *in_stack_ffffffffffffffe8;
  size_t local_8;
  
  this = (__atomic_base<long> *)std::__atomic_base::operator_cast_to_long(in_stack_ffffffffffffffe8)
  ;
  p_Var1 = (__atomic_base<long> *)std::__atomic_base::operator_cast_to_long(this);
  if (p_Var1 == this) {
    uVar2 = *(ulong *)(in_RDI + 0x20);
  }
  else {
    uVar2 = (ulong)((long)p_Var1 + (*(long *)(in_RDI + 0x20) - (long)this)) %
            *(ulong *)(in_RDI + 0x20);
  }
  local_8 = uVar2 - 1;
  return local_8;
}

Assistant:

static size_t ring_write_size(ringbuffer_t *ring)
{
    //leave one forbidden element
    const size_t w = ring->write;
    const size_t r = ring->read;
    if(r == w)
        return ring->size - 1;
    return ((r - w + ring->size) % ring->size) - 1;
}